

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O0

bool __thiscall trun::TestFunc::IsGlobalExit(TestFunc *this)

{
  bool bVar1;
  Config *pCVar2;
  __type local_11;
  TestFunc *this_local;
  
  bVar1 = IsGlobal(this);
  local_11 = false;
  if (bVar1) {
    pCVar2 = Config::Instance();
    local_11 = std::operator==(&this->caseName,&pCVar2->exitFuncName);
  }
  return local_11;
}

Assistant:

bool TestFunc::IsGlobalExit() {
    return (IsGlobal() && (caseName == Config::Instance().exitFuncName));
}